

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

void DecodeFunction(w3Module *module,w3Code *code,uint8_t **cursor)

{
  uint32_t uVar1;
  vector<w3Tag,_std::allocator<w3Tag>_> *this;
  size_type sVar2;
  w3Tag local_39;
  ulong uStack_38;
  w3Tag value_type;
  size_t j;
  size_t i;
  size_t local_type_count;
  uint8_t **cursor_local;
  w3Code *code_local;
  w3Module *module_local;
  
  local_type_count = (size_t)cursor;
  cursor_local = (uint8_t **)code;
  code_local = (w3Code *)module;
  uVar1 = w3Module::read_varuint32(module,cursor);
  i = (size_t)uVar1;
  printf("local_type_count:%lX\n",i);
  for (j = 0; j < i; j = j + 1) {
    uVar1 = w3Module::read_varuint32((w3Module *)code_local,(uint8_t **)local_type_count);
    uStack_38 = (ulong)uVar1;
    local_39 = w3Module::read_valuetype((w3Module *)code_local,(uint8_t **)local_type_count);
    printf("local_type_count %lX-of-%lX count:%lX type:%X\n",j,i,uStack_38,(ulong)local_39);
    this = (vector<w3Tag,_std::allocator<w3Tag>_> *)(cursor_local + 2);
    sVar2 = std::vector<w3Tag,_std::allocator<w3Tag>_>::size
                      ((vector<w3Tag,_std::allocator<w3Tag>_> *)(cursor_local + 2));
    std::vector<w3Tag,_std::allocator<w3Tag>_>::resize(this,sVar2 + uStack_38,&local_39);
  }
  DecodeInstructions((w3Module *)code_local,
                     (vector<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_> *)
                     (cursor_local + 5),(uint8_t **)local_type_count,(w3Code *)cursor_local);
  return;
}

Assistant:

void DecodeFunction (w3Module* module, w3Code* code, uint8_t** cursor)
{
    // read count of types
    // for each type
    //   read type and count for that type
    const size_t local_type_count = module->read_varuint32 (cursor);
    printf ("local_type_count:%" FORMAT_SIZE "X\n", local_type_count);
    for (size_t i = 0; i < local_type_count; ++i)
    {
        const size_t j = module->read_varuint32 (cursor);
        w3Tag value_type = module->read_valuetype (cursor);
        printf ("local_type_count %" FORMAT_SIZE "X-of-%" FORMAT_SIZE "X count:%" FORMAT_SIZE "X type:%X\n", i, local_type_count, j, value_type);
        code->locals.resize (code->locals.size () + j, value_type);
    }
    DecodeInstructions (module, code->decoded_instructions, cursor, code);
}